

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int isViableStructureTerrain(int structType,Generator *g,int x,int z)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double adStack_80 [6];
  double local_50;
  double dStack_48;
  double local_40;
  
  iVar3 = 1;
  if (0x15 < g->mc) {
    if (structType - 1U < 2) {
      iVar4 = (uint)(structType == 1) * 9 + 0xc;
      iVar2 = 0xf;
      if (structType == 1) {
        iVar2 = 0x15;
      }
    }
    else {
      if (structType != 9) {
        return 1;
      }
      uVar5 = g->seed ^ 0x5deece66d;
      lVar7 = uVar5 * 0x5deece66d + 0xb;
      uVar8 = lVar7 * 0x5deece66d + 0xb;
      lVar9 = (uVar8 & 0xffffffffffff) * 0x5deece66d + 0xb;
      uVar6 = (uint)(((long)(x >> 4) *
                      ((long)(int)(uVar8 >> 0x10) + (ulong)((uint)lVar7 & 0xffff0000) * 0x10000) ^
                      uVar5 ^ (long)(z >> 4) *
                              ((lVar9 * 0x5deece66d0000 + 0xb0000 >> 0x20) +
                              (ulong)((uint)lVar9 & 0xffff0000) * 0x10000)) * 0x5deece66d + 0xb >>
                    0x2e) & 3;
      iVar4 = 5;
      if (uVar6 < 2) {
        iVar4 = -5;
      }
      iVar2 = 5;
      if (uVar6 - 1 < 2) {
        iVar2 = -5;
      }
      x = x & 0xfffffff0U | 7;
      z = z & 0xfffffff0U | 7;
    }
    adStack_80[3] = (double)(iVar4 + x) * 0.25;
    adStack_80[2] = (double)z * 0.25;
    adStack_80[4] = (double)(iVar2 + z) * 0.25;
    adStack_80[1] = (double)x * 0.25;
    adStack_80[5] = (double)x * 0.25;
    local_50 = adStack_80[4];
    dStack_48 = adStack_80[3];
    local_40 = (double)z * 0.25;
    uVar1 = *(undefined4 *)((long)&g->field_5 + 0x6008);
    *(undefined4 *)((long)&g->field_5 + 0x6008) = 4;
    lVar7 = 8;
    do {
      adStack_80[0] = 5.48731539225351e-318;
      dVar11 = sampleClimatePara((BiomeNoise *)&(g->field_5).field_0,(int64_t *)0x0,
                                 *(double *)((long)adStack_80 + lVar7),
                                 *(double *)((long)adStack_80 + lVar7 + 8));
      if (dVar11 < 0.48) {
        iVar3 = 0;
        break;
      }
      bVar10 = lVar7 != 0x38;
      lVar7 = lVar7 + 0x10;
    } while (bVar10);
    *(undefined4 *)((long)&g->field_5 + 0x6008) = uVar1;
  }
  return iVar3;
}

Assistant:

int isViableStructureTerrain(int structType, Generator *g, int x, int z)
{
    int sx, sz;
    if (g->mc <= MC_1_17)
        return 1;
    if (structType == Desert_Pyramid || structType == Jungle_Temple)
    {
        sx = (structType == Desert_Pyramid ? 21 : 12);
        sz = (structType == Desert_Pyramid ? 21 : 15);
    }
    else if (structType == Mansion)
    {
        int cx = x >> 4, cz = z >> 4;
        uint64_t rng = chunkGenerateRnd(g->seed, cx, cz);
        int rot = nextInt(&rng, 4);
        sx = 5;
        sz = 5;
        if (rot == 0) { sx = -5; }
        if (rot == 1) { sx = -5; sz = -5; }
        if (rot == 2) { sz = -5; }
        x = cx * 16 + 7;
        z = cz * 16 + 7;
    }
    else
    {
        return 1;
    }

    // approx surface height using depth parameter (0.5 ~ sea level)
    double corners[][2] = {
        {(x+ 0)/4.0, (z+ 0)/4.0},
        {(x+sx)/4.0, (z+sz)/4.0},
        {(x+ 0)/4.0, (z+sz)/4.0},
        {(x+sx)/4.0, (z+ 0)/4.0},
    };
    int nptype = g->bn.nptype;
    int i, ret = 1;
    g->bn.nptype = NP_DEPTH;
    for (i = 0; i < 4; i++)
    {
        double depth = sampleClimatePara(&g->bn, 0, corners[i][0], corners[i][1]);
        if (depth < 0.48)
        {
            ret = 0;
            break;
        }
    }
    g->bn.nptype = nptype;
    return ret;
}